

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request_blocks.cpp
# Opt level: O3

bool libtorrent::request_a_block(torrent *t,peer_connection *c)

{
  int *piVar1;
  pointer ppVar2;
  pointer ppVar3;
  _Head_base<0UL,_libtorrent::piece_picker_*,_false> this;
  session_interface *psVar4;
  _Head_base<0UL,_unsigned_int_*,_false> _Var5;
  pointer psVar6;
  _Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_> _Var7;
  pointer pppVar8;
  pointer pppVar9;
  pointer psVar10;
  pointer psVar11;
  pointer ppVar12;
  bool bVar13;
  bool bVar14;
  download_priority_t dVar15;
  picker_options_t options;
  int iVar16;
  int iVar17;
  int iVar18;
  vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_> *pvVar19;
  session_settings *psVar20;
  undefined4 extraout_var;
  vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_> *pvVar21;
  _Head_base<0UL,_unsigned_int_*,_false> *p_Var22;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *ptVar23;
  vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  *pvVar24;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  alert_manager *paVar25;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  __normal_iterator<const_libtorrent::pending_block_*,_std::vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>_>
  _Var26;
  uint uVar27;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *i;
  pointer psVar28;
  uint uVar29;
  uint uVar30;
  piece_index_t pVar31;
  piece_block pVar32;
  piece_block *block;
  ulong uVar33;
  ulong local_c8;
  _Head_base<0UL,_unsigned_int_*,_false> local_a0;
  vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_> interesting_pieces;
  _Head_base<0UL,_unsigned_int_*,_false> *local_78;
  picker_flags_t flags;
  _Head_base<0UL,_libtorrent::piece_picker_*,_false> local_48;
  piece_block busy_block;
  
  bVar13 = torrent::is_seed(t);
  if ((((!bVar13) && ((c->field_0x762 & 0x10) == 0)) &&
      (((t->super_torrent_hot_members).field_0x3b & 0x81) == 0)) &&
     (((iVar16 = (*(c->super_bandwidth_socket)._vptr_bandwidth_socket[1])(c), (char)iVar16 == '\0'
       && (0 < (((t->super_torrent_hot_members).m_torrent_file.
                 super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               m_files).m_piece_length)) &&
      (((t->field_0x5a0 & 8) != 0 && (((t->super_torrent_hot_members).field_0x3b & 0x80) == 0))))))
  {
    iVar16 = (int)((ulong)((long)(t->m_time_critical_pieces).
                                 super__Vector_base<libtorrent::time_critical_piece,_std::allocator<libtorrent::time_critical_piece>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(t->m_time_critical_pieces).
                                super__Vector_base<libtorrent::time_critical_piece,_std::allocator<libtorrent::time_critical_piece>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
    uVar33 = 1;
    bVar13 = iVar16 < 1;
    if (iVar16 < 1) {
      uVar33 = 1;
      if (((c->super_peer_connection_hot_members).field_0x28 & 0xc) == 0) {
        uVar33 = (ulong)c->m_desired_queue_size;
      }
    }
    pvVar19 = peer_connection::download_queue(c);
    ppVar2 = (pvVar19->
             super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    ppVar3 = (pvVar19->
             super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar19 = peer_connection::request_queue(c);
    uVar30 = (int)((ulong)((long)ppVar2 - (long)ppVar3) >> 2) * 0x55555555 + (int)uVar33 +
             (int)((ulong)((long)(pvVar19->
                                 super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pvVar19->
                                super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 2) * 0x55555555;
    local_c8 = (ulong)uVar30;
    bVar14 = peer_connection::should_log(c,info);
    if (bVar14) {
      pvVar19 = peer_connection::download_queue(c);
      ppVar2 = (pvVar19->
               super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      ppVar3 = (pvVar19->
               super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pvVar19 = peer_connection::request_queue(c);
      peer_connection::peer_log
                (c,info,"PIECE_PICKER","dlq: %d rqq: %d target: %d req: %d engame: %d",
                 (ulong)(uint)((int)((ulong)((long)ppVar2 - (long)ppVar3) >> 2) * -0x55555555),
                 (ulong)(uint)((int)((ulong)((long)(pvVar19->
                                                                                                      
                                                  super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(pvVar19->
                                                  super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                                                  )._M_impl.super__Vector_impl_data._M_start) >> 2)
                              * -0x55555555),uVar33,local_c8,
                 (ulong)(*(uint *)&(c->super_peer_connection_hot_members).field_0x28 >> 2 & 1));
    }
    if (0 < (int)uVar30) {
      torrent::need_picker(t);
      this._M_head_impl =
           (t->super_torrent_hot_members).m_picker._M_t.
           super___uniq_ptr_impl<libtorrent::piece_picker,_std::default_delete<libtorrent::piece_picker>_>
           ._M_t.
           super__Tuple_impl<0UL,_libtorrent::piece_picker_*,_std::default_delete<libtorrent::piece_picker>_>
           .super__Head_base<0UL,_libtorrent::piece_picker_*,_false>._M_head_impl;
      interesting_pieces.
      super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      interesting_pieces.
      super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      interesting_pieces.
      super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>::reserve
                (&interesting_pieces,100);
      bVar14 = peer_connection::on_parole(c);
      uVar27 = 1;
      if (!bVar14) {
        uVar27 = c->m_prefer_contiguous_blocks;
      }
      if (iVar16 < 1 && uVar27 == 0) {
        psVar20 = torrent::settings(t);
        iVar17 = aux::session_settings::get_int(psVar20,0x4009);
        if (iVar17 < 1) {
          uVar27 = 0;
        }
        else {
          iVar17 = (*(c->super_bandwidth_socket)._vptr_bandwidth_socket[0x10])(c);
          iVar17 = *(int *)(CONCAT44(extraout_var,iVar17) + 0x2c);
          psVar20 = torrent::settings(t);
          iVar18 = aux::session_settings::get_int(psVar20,0x4009);
          iVar18 = iVar18 * iVar17;
          if (0x7fffff < iVar18) {
            iVar18 = 0x800000;
          }
          uVar27 = (((t->super_torrent_hot_members).m_torrent_file.
                     super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    )->m_files).m_piece_length;
          uVar29 = 0x4000;
          if (uVar27 < 0x4000) {
            uVar29 = uVar27;
          }
          if ((int)uVar27 < 1) {
            uVar29 = 0x4000;
          }
          uVar27 = ((int)uVar27 / (int)uVar29) * (iVar18 / (int)uVar27);
        }
      }
      psVar4 = (t->super_torrent_hot_members).m_ses;
      pvVar19 = peer_connection::download_queue(c);
      pvVar21 = peer_connection::request_queue(c);
      p_Var22 = (_Head_base<0UL,_unsigned_int_*,_false> *)peer_connection::get_bitfield(c);
      local_a0._M_head_impl = (uint *)0x0;
      local_78 = p_Var22;
      if ((c->field_0x762 & 0x40) != 0) {
        ptVar23 = peer_connection::get_bitfield(c);
        _Var5._M_head_impl =
             *(uint **)&(ptVar23->super_bitfield).m_buf.
                        super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                        super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
        ;
        if ((_Head_base<0UL,_unsigned_int_*,_false>)_Var5._M_head_impl ==
            (_Head_base<0UL,_unsigned_int_*,_false>)0x0) {
          uVar29 = 0;
        }
        else {
          uVar29 = *_Var5._M_head_impl;
        }
        bitfield::resize((bitfield *)&local_a0,uVar29,false);
        pvVar24 = peer_connection::allowed_fast(c);
        psVar28 = (pvVar24->
                  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        psVar6 = (pvVar24->
                 super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        local_78 = &local_a0;
        if (psVar28 != psVar6) {
          _Var7.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
               (((unique_ptr<unsigned_int[],_long> *)&p_Var22->_M_head_impl)->
               super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>)._M_t.
               super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
               super__Head_base<0UL,_unsigned_int_*,_false>;
          do {
            iVar17 = psVar28->m_val;
            iVar18 = iVar17 + 0x1f;
            if (-1 < iVar17) {
              iVar18 = iVar17;
            }
            uVar29 = 0x80000000 >> ((byte)iVar17 & 0x1f);
            uVar29 = uVar29 >> 0x18 | (uVar29 & 0xff0000) >> 8 | (uVar29 & 0xff00) << 8 |
                     uVar29 << 0x18;
            if ((*(uint *)((long)_Var7.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + 4
                          + (long)(iVar18 >> 5) * 4) & uVar29) != 0) {
              local_a0._M_head_impl[(long)(iVar18 >> 5) + 1] =
                   local_a0._M_head_impl[(long)(iVar18 >> 5) + 1] | uVar29;
            }
            psVar28 = psVar28 + 1;
          } while (psVar28 != psVar6);
        }
      }
      iVar17 = (*(c->super_bandwidth_socket)._vptr_bandwidth_socket[9])(c);
      options = peer_connection::picker_options(c);
      pppVar8 = (t->super_torrent_hot_members).m_connections.
                super_vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
                .
                super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pppVar9 = (t->super_torrent_hot_members).m_connections.
                super_vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
                .
                super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      psVar10 = (t->m_peers_to_disconnect).
                super__Vector_base<std::shared_ptr<libtorrent::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::peer_connection>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      psVar11 = (t->m_peers_to_disconnect).
                super__Vector_base<std::shared_ptr<libtorrent::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::peer_connection>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      iVar18 = (*(psVar4->super_session_logger)._vptr_session_logger[0x4b])();
      flags = piece_picker::pick_pieces
                        (this._M_head_impl,
                         (typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                          *)local_78,&interesting_pieces,uVar30,uVar27,
                         (torrent_peer *)CONCAT44(extraout_var_00,iVar17),options,
                         &(c->m_suggested_pieces).
                          super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                         ,(int)((ulong)((long)pppVar9 - (long)pppVar8) >> 3) -
                          (int)((ulong)((long)psVar10 - (long)psVar11) >> 4),
                         (counters *)CONCAT44(extraout_var_01,iVar18));
      paVar25 = torrent::alerts(t);
      if ((((paVar25->m_alert_mask)._M_i.m_val >> 0x14 & 1) != 0) &&
         (interesting_pieces.
          super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          interesting_pieces.
          super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>.
          _M_impl.super__Vector_impl_data._M_finish)) {
        paVar25 = torrent::alerts(t);
        torrent::get_handle((torrent *)&stack0xffffffffffffffb0);
        iVar17 = (*(c->super_bandwidth_socket)._vptr_bandwidth_socket[0x12])(c);
        iVar18 = (*(c->super_bandwidth_socket)._vptr_bandwidth_socket[0xd])(c);
        alert_manager::
        emplace_alert<libtorrent::picker_log_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,libtorrent::digest32<160l>const&,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::picker_flags_tag,void>const&,std::vector<libtorrent::piece_block,std::allocator<libtorrent::piece_block>>&>
                  (paVar25,(torrent_handle *)&stack0xffffffffffffffb0,
                   (basic_endpoint<boost::asio::ip::tcp> *)CONCAT44(extraout_var_02,iVar17),
                   (digest32<160L> *)CONCAT44(extraout_var_03,iVar18),&flags,&interesting_pieces);
        if ((_Head_base<0UL,_libtorrent::piece_picker_*,_false>)local_48._M_head_impl !=
            (_Head_base<0UL,_libtorrent::piece_picker_*,_false>)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            piVar1 = (int *)((long)&((local_48._M_head_impl)->m_piece_map).
                                    super_vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                                    .
                                    super__Vector_base<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + 4);
            iVar17 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
          }
          else {
            iVar17 = *(int *)((long)&((local_48._M_head_impl)->m_piece_map).
                                     super_vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                                     .
                                     super__Vector_base<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + 4);
            *(int *)((long)&((local_48._M_head_impl)->m_piece_map).
                            super_vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                            .
                            super__Vector_base<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                            ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar17 + -1;
          }
          if (iVar17 == 1) {
            (*(code *)((local_48._M_head_impl)->m_piece_map).
                      super_vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                      .
                      super__Vector_base<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                      ._M_impl.super__Vector_impl_data._M_start[3])();
          }
        }
      }
      peer_connection::peer_log
                (c,info,"PIECE_PICKER","prefer_contiguous: %d picked: %d",(ulong)uVar27,
                 (ulong)((long)interesting_pieces.
                               super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)interesting_pieces.
                              super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
      iVar17 = (*(psVar4->super_session_logger)._vptr_session_logger[0x2d])();
      bVar14 = aux::session_settings::get_bool
                         ((session_settings *)CONCAT44(extraout_var_04,iVar17),0x801e);
      if (((!bVar14) ||
          (iVar17 = piece_picker::get_download_queue_size(this._M_head_impl),
          ((this._M_head_impl)->m_num_have_filtered -
          ((this._M_head_impl)->m_num_filtered + (this._M_head_impl)->m_num_have)) +
          (int)((ulong)((long)((this._M_head_impl)->m_piece_map).
                              super_vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                              .
                              super__Vector_base<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       *(long *)&(this._M_head_impl)->m_piece_map) >> 3) <= iVar17)) &&
         (((long)(pvVar19->
                 super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(pvVar19->
                 super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 +
          ((long)(pvVar21->
                 super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(pvVar21->
                 super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 == 0)) {
        bVar13 = false;
      }
      ppVar12 = interesting_pieces.
                super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pVar32.piece_index.m_val = 0x7fffffff;
      pVar32.block_index = 0x7fffffff;
      pVar31.m_val = 0x7fffffff;
      busy_block.piece_index.m_val = 0x7fffffff;
      busy_block.block_index = 0x7fffffff;
      uVar33 = 0x7fffffff;
      iVar17 = 0x7fffffff;
      for (block = interesting_pieces.
                   super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                   ._M_impl.super__Vector_impl_data._M_start; block != ppVar12; block = block + 1) {
        pVar31 = pVar32.piece_index.m_val;
        iVar17 = (int)uVar33;
        if ((uVar27 == 0) && ((int)(uint)local_c8 < 1)) goto LAB_002425ff;
        uVar30 = (uint)local_c8;
        if ((0 < iVar16) &&
           (dVar15 = piece_picker::piece_priority
                               (this._M_head_impl,(piece_index_t)(block->piece_index).m_val),
           dVar15.m_val != '\a')) break;
        iVar18 = piece_picker::num_peers(this._M_head_impl,*block);
        if (iVar18 < 1) {
          _Var26 = std::
                   __find_if<__gnu_cxx::__normal_iterator<libtorrent::pending_block_const*,std::vector<libtorrent::pending_block,std::allocator<libtorrent::pending_block>>>,__gnu_cxx::__ops::_Iter_pred<libtorrent::aux::has_block>>
                             ((pvVar19->
                              super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                              )._M_impl.super__Vector_impl_data._M_start,
                              (pvVar19->
                              super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                              )._M_impl.super__Vector_impl_data._M_finish,block);
          if ((_Var26._M_current ==
               (pvVar19->
               super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
               )._M_impl.super__Vector_impl_data._M_finish) &&
             (_Var26 = std::
                       __find_if<__gnu_cxx::__normal_iterator<libtorrent::pending_block_const*,std::vector<libtorrent::pending_block,std::allocator<libtorrent::pending_block>>>,__gnu_cxx::__ops::_Iter_pred<libtorrent::aux::has_block>>
                                 ((pvVar21->
                                  super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                                  )._M_impl.super__Vector_impl_data._M_start,
                                  (pvVar21->
                                  super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                                  )._M_impl.super__Vector_impl_data._M_finish,block),
             _Var26._M_current ==
             (pvVar21->
             super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
             )._M_impl.super__Vector_impl_data._M_finish)) {
            bVar14 = peer_connection::add_request(c,block,(request_flags_t)0x0);
            local_c8 = (ulong)((uint)local_c8 - bVar14);
          }
          else {
            peer_connection::peer_log
                      (c,info,"PIECE_PICKER","not_picking: %d,%d already in queue",
                       (ulong)(uint)(block->piece_index).m_val,(ulong)(uint)block->block_index);
          }
        }
        else {
          if ((int)(uint)local_c8 < 1 || bVar13) break;
          pVar32 = *block;
          uVar33 = (ulong)pVar32 >> 0x20;
          busy_block = pVar32;
        }
        pVar31 = pVar32.piece_index.m_val;
        iVar17 = (int)uVar33;
        uVar30 = (uint)local_c8;
      }
      local_c8._0_4_ = uVar30;
      if ((int)(uint)local_c8 < 1) {
LAB_002425ff:
        peer_connection::set_endgame(c,false);
      }
      else {
        if ((c->field_0x762 & 0x40) == 0) {
          peer_connection::set_endgame(c,true);
        }
        if (((pVar31.m_val != 0x7fffffff) || (iVar17 != 0x7fffffff)) &&
           (((long)(pvVar19->
                   super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(pvVar19->
                   super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 +
            ((long)(pvVar21->
                   super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(pvVar21->
                   super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 == 0)) {
          peer_connection::add_request(c,&busy_block,(request_flags_t)0x2);
        }
      }
      if (local_a0._M_head_impl != (uint *)0x0) {
        operator_delete__(local_a0._M_head_impl);
      }
      if (interesting_pieces.
          super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(interesting_pieces.
                        super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)interesting_pieces.
                              super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)interesting_pieces.
                              super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool request_a_block(torrent& t, peer_connection& c)
	{
		if (t.is_seed()) return false;
		if (c.no_download()) return false;
		if (t.upload_mode()) return false;
		if (c.is_disconnecting()) return false;

		// don't request pieces before we have the metadata
		if (!t.valid_metadata()) return false;

		// don't request pieces before the peer is properly
		// initialized after we have the metadata
		if (!t.are_files_checked()) return false;

		// we don't want to request more blocks while trying to gracefully pause
		if (t.graceful_pause()) return false;

		TORRENT_ASSERT(c.peer_info_struct() != nullptr
			|| c.type() != connection_type::bittorrent);

		bool const time_critical_mode = t.num_time_critical_pieces() > 0;

		// in time critical mode, only have 1 outstanding request at a time
		// via normal requests
		int const desired_queue_size = time_critical_mode
			? 1 : c.desired_queue_size();

		int num_requests = desired_queue_size
			- int(c.download_queue().size())
			- int(c.request_queue().size());

#ifndef TORRENT_DISABLE_LOGGING
		if (c.should_log(peer_log_alert::info))
		{
			c.peer_log(peer_log_alert::info, "PIECE_PICKER"
				, "dlq: %d rqq: %d target: %d req: %d engame: %d"
				, int(c.download_queue().size()), int(c.request_queue().size())
				, desired_queue_size, num_requests, c.endgame());
		}
#endif
		TORRENT_ASSERT(desired_queue_size > 0);
		// if our request queue is already full, we
		// don't have to make any new requests yet
		if (num_requests <= 0) return false;

		t.need_picker();

		piece_picker& p = t.picker();
		std::vector<piece_block> interesting_pieces;
		interesting_pieces.reserve(100);

		int prefer_contiguous_blocks = c.prefer_contiguous_blocks();

		if (prefer_contiguous_blocks == 0
			&& !time_critical_mode
			&& t.settings().get_int(settings_pack::whole_pieces_threshold) > 0)
		{
			// if our download rate lets us download a whole piece in
			// "whole_pieces_threshold" seconds, we prefer to pick an entire piece.
			// If we can download multiple whole pieces, we prefer to download that
			// many contiguous pieces.

			// download_rate times the whole piece threshold (seconds) gives the
			// number of bytes downloaded in one window of that threshold, divided
			// by the piece size give us the number of (whole) pieces downloaded
			// in the window.
			int const contiguous_pieces =
				std::min(c.statistics().download_payload_rate()
				* t.settings().get_int(settings_pack::whole_pieces_threshold)
				, 8 * 1024 * 1024)
				/ t.torrent_file().piece_length();

			int const blocks_per_piece = t.torrent_file().piece_length() / t.block_size();

			prefer_contiguous_blocks = contiguous_pieces * blocks_per_piece;
		}

		// if we prefer whole pieces, the piece picker will pick at least
		// the number of blocks we want, but it will try to make the picked
		// blocks be from whole pieces, possibly by returning more blocks
		// than we requested.
#if TORRENT_USE_ASSERTS
		error_code ec;
		TORRENT_ASSERT(c.remote() == c.get_socket()->remote_endpoint(ec) || ec);
#endif

		aux::session_interface& ses = t.session();

		std::vector<pending_block> const& dq = c.download_queue();
		std::vector<pending_block> const& rq = c.request_queue();

		std::vector<piece_index_t> const& suggested = c.suggested_pieces();
		auto const* bits = &c.get_bitfield();
		typed_bitfield<piece_index_t> fast_mask;

		if (c.has_peer_choked())
		{
			// if we are choked we can only pick pieces from the
			// allowed fast set. The allowed fast set is sorted
			// in ascending priority order

			// build a bitmask with only the allowed pieces in it
			fast_mask.resize(c.get_bitfield().size(), false);
			for (auto const& i : c.allowed_fast())
			{
				if ((*bits)[i]) fast_mask.set_bit(i);
			}
			bits = &fast_mask;
		}

		// picks the interesting pieces from this peer
		// the integer is the number of pieces that
		// should be guaranteed to be available for download
		// (if num_requests is too big, too many pieces are
		// picked and cpu-time is wasted)
		// the last argument is if we should prefer whole pieces
		// for this peer. If we're downloading one piece in 20 seconds
		// then use this mode.
		picker_flags_t const flags = p.pick_pieces(*bits, interesting_pieces
			, num_requests, prefer_contiguous_blocks, c.peer_info_struct()
			, c.picker_options(), suggested, t.num_peers()
			, ses.stats_counters());

#ifndef TORRENT_DISABLE_LOGGING
		if (t.alerts().should_post<picker_log_alert>()
			&& !interesting_pieces.empty())
		{
			t.alerts().emplace_alert<picker_log_alert>(t.get_handle(), c.remote()
				, c.pid(), flags, interesting_pieces);
		}
		c.peer_log(peer_log_alert::info, "PIECE_PICKER"
			, "prefer_contiguous: %d picked: %d"
			, prefer_contiguous_blocks, int(interesting_pieces.size()));
#else
		TORRENT_UNUSED(flags);
#endif

		// if the number of pieces we have + the number of pieces
		// we're requesting from is less than the number of pieces
		// in the torrent, there are still some unrequested pieces
		// and we're not strictly speaking in end-game mode yet
		// also, if we already have at least one outstanding
		// request, we shouldn't pick any busy pieces either
		// in time critical mode, it's OK to request busy blocks
		bool const dont_pick_busy_blocks
			= ((ses.settings().get_bool(settings_pack::strict_end_game_mode)
				&& p.get_download_queue_size() < p.num_want_left())
				|| dq.size() + rq.size() > 0)
				&& !time_critical_mode;

		// this is filled with an interesting piece
		// that some other peer is currently downloading
		piece_block busy_block = piece_block::invalid;

		for (piece_block const& pb : interesting_pieces)
		{
			if (prefer_contiguous_blocks == 0 && num_requests <= 0) break;

			if (time_critical_mode && p.piece_priority(pb.piece_index) != top_priority)
			{
				// assume the subsequent pieces are not prio 7 and
				// be done
				break;
			}

			int num_block_requests = p.num_peers(pb);
			if (num_block_requests > 0)
			{
				// have we picked enough pieces?
				if (num_requests <= 0) break;

				// this block is busy. This means all the following blocks
				// in the interesting_pieces list are busy as well, we might
				// as well just exit the loop
				if (dont_pick_busy_blocks) break;

				TORRENT_ASSERT(p.num_peers(pb) > 0);
				busy_block = pb;
				continue;
			}

			TORRENT_ASSERT(p.num_peers(pb) == 0);

			// don't request pieces we already have in our request queue
			// This happens when pieces time out or the peer sends us
			// pieces we didn't request. Those aren't marked in the
			// piece picker, but we still keep track of them in the
			// download queue
			if (std::find_if(dq.begin(), dq.end(), aux::has_block(pb)) != dq.end()
				|| std::find_if(rq.begin(), rq.end(), aux::has_block(pb)) != rq.end())
			{
#if TORRENT_USE_ASSERTS
				std::vector<pending_block>::const_iterator j
					= std::find_if(dq.begin(), dq.end(), aux::has_block(pb));
				if (j != dq.end()) TORRENT_ASSERT(j->timed_out || j->not_wanted);
#endif
#ifndef TORRENT_DISABLE_LOGGING
				c.peer_log(peer_log_alert::info, "PIECE_PICKER"
					, "not_picking: %d,%d already in queue"
					, static_cast<int>(pb.piece_index), pb.block_index);
#endif
				continue;
			}

			// ok, we found a piece that's not being downloaded
			// by somebody else. request it from this peer
			// and return
			if (!c.add_request(pb, {})) continue;
			TORRENT_ASSERT(p.num_peers(pb) == 1);
			TORRENT_ASSERT(p.is_requested(pb));
			num_requests--;
		}

		// we have picked as many blocks as we should
		// we're done!
		if (num_requests <= 0)
		{
			// since we could pick as many blocks as we
			// requested without having to resort to picking
			// busy ones, we're not in end-game mode
			c.set_endgame(false);
			return true;
		}

		// we did not pick as many pieces as we wanted, because
		// there aren't enough. This means we're in end-game mode
		// as long as we have at least one request outstanding,
		// we shouldn't pick another piece
		// if we are attempting to download 'allowed' pieces
		// and can't find any, that doesn't count as end-game
		if (!c.has_peer_choked())
			c.set_endgame(true);

		// if we don't have any potential busy blocks to request
		// or if we already have outstanding requests, don't
		// pick a busy piece
		if (busy_block == piece_block::invalid
			|| dq.size() + rq.size() > 0)
		{
			return true;
		}

#if TORRENT_USE_ASSERTS
		piece_picker::downloading_piece st;
		p.piece_info(busy_block.piece_index, st);
		TORRENT_ASSERT(st.requested + st.finished + st.writing
			== p.blocks_in_piece(busy_block.piece_index));
#endif
		TORRENT_ASSERT(p.is_requested(busy_block));
		TORRENT_ASSERT(!p.is_downloaded(busy_block));
		TORRENT_ASSERT(!p.is_finished(busy_block));
		TORRENT_ASSERT(p.num_peers(busy_block) > 0);

		c.add_request(busy_block, peer_connection::busy);
		return true;
	}